

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_tree_visitor.cpp
# Opt level: O3

void __thiscall ir_tree_visitor::visit(ir_tree_visitor *this,IntValue *ptr)

{
  ExpressionWrapper *this_00;
  ConstExpression *this_01;
  
  this_00 = (ExpressionWrapper *)operator_new(0x10);
  this_01 = (ConstExpression *)operator_new(0x10);
  IRT::ConstExpression::ConstExpression(this_01,ptr->value);
  IRT::ExpressionWrapper::ExpressionWrapper(this_00,(Expression *)this_01);
  this->curr_wrapper = (SubtreeWrapper *)this_00;
  return;
}

Assistant:

void ir_tree_visitor::visit(IntValue* ptr) {
    curr_wrapper = new IRT::ExpressionWrapper(
            new IRT::ConstExpression(ptr->value));
    //value(int)
}